

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::CopyFileIfDifferent(char *source,char *destination)

{
  bool bVar1;
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,source,&local_49);
  std::__cxx11::string::string((string *)&local_48,destination,&local_4a);
  bVar1 = cmsys::SystemTools::CopyFileIfDifferent(&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return bVar1;
}

Assistant:

bool cmSystemTools::CopyFileIfDifferent(const char* source,
  const char* destination)
{
  return Superclass::CopyFileIfDifferent(source, destination);
}